

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O3

ostream * MinVR::operator<<(ostream *os,VRPoint3 *p)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  poVar1 = std::ostream::_M_insert<double>((double)p->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)p->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
  poVar1 = std::ostream::_M_insert<double>((double)p->z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRPoint3 &p) {
  return os << "(" << p.x << ", " << p.y << ", " << p.z << ")";
}